

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall
TTD::TextFormatReader::ReadKey(TextFormatReader *this,Key keyCheck,bool readSeparator)

{
  int iVar1;
  ParseTokenKind PVar2;
  char16_t *string1;
  undefined8 in_RCX;
  ParseTokenKind toksep;
  char16 *kname;
  char16 *keystr;
  ParseTokenKind local_18;
  undefined1 local_12;
  Key local_11;
  ParseTokenKind tok;
  bool readSeparator_local;
  Key keyCheck_local;
  TextFormatReader *this_local;
  
  local_12 = readSeparator;
  local_11 = keyCheck;
  _tok = this;
  (*(this->super_FileReader)._vptr_FileReader[2])
            (this,(ulong)readSeparator & 1,readSeparator,
             CONCAT71((int7)((ulong)in_RCX >> 8),readSeparator) & 0xffffffffffffff01);
  local_18 = ScanKey(this,&this->m_charListPrimary);
  if (local_18 != String) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  keystr._6_2_ = 0;
  JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (&this->m_charListPrimary,(char16_t *)((long)&keystr + 6));
  string1 = JsUtil::ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>::GetBuffer
                      (&(this->m_charListPrimary).
                        super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>);
  if ((local_11 == Invalid) || (argument < local_11)) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  if (this->m_keyNameArray[local_11] == (char16_t *)0x0) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  iVar1 = PAL_wcscmp(string1,this->m_keyNameArray[local_11]);
  if (iVar1 != 0) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  PVar2 = Scan(this,&this->m_charListDiscard);
  if (PVar2 != Colon) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  return;
}

Assistant:

void TextFormatReader::ReadKey(NSTokens::Key keyCheck, bool readSeparator)
    {
        this->ReadSeparator(readSeparator);

        //We do a special scan here for a key (instead of the more general scan we call elsewhere)
        NSTokens::ParseTokenKind tok = this->ScanKey(this->m_charListPrimary);
        TTDAssert(tok == NSTokens::ParseTokenKind::String, "Error in parse.");

        this->m_charListPrimary.Add(_u('\0'));
        const char16* keystr = this->m_charListPrimary.GetBuffer();

        //check key strings are the same
        TTDAssert(1 <= (uint32)keyCheck && (uint32)keyCheck < (uint32)NSTokens::Key::Count, "Error in parse.");
        const char16* kname = this->m_keyNameArray[(uint32)keyCheck];
        TTDAssert(kname != nullptr, "Error in parse.");
        TTDAssert(wcscmp(keystr, kname) == 0, "Error in parse.");

        NSTokens::ParseTokenKind toksep = this->Scan(this->m_charListDiscard);
        TTDAssert(toksep == NSTokens::ParseTokenKind::Colon, "Error in parse.");
    }